

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall mkvparser::Cluster::GetNext(Cluster *this,BlockEntry *pCurr,BlockEntry **pNext)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long len;
  longlong pos;
  long lStack_28;
  longlong local_20;
  
  lVar1 = pCurr->m_index;
  if (lVar1 + 1U < (ulong)this->m_entries_count) goto LAB_00160d73;
  lVar3 = Parse(this,&local_20,&lStack_28);
  if (lVar3 < 0) {
LAB_00160d62:
    *pNext = (BlockEntry *)0x0;
    bVar2 = false;
  }
  else {
    if (lVar3 != 0) {
      lVar3 = 0;
      goto LAB_00160d62;
    }
    bVar2 = true;
  }
  if (!bVar2) {
    return lVar3;
  }
LAB_00160d73:
  *pNext = this->m_entries[lVar1 + 1];
  return 0;
}

Assistant:

long Cluster::GetNext(const BlockEntry* pCurr, const BlockEntry*& pNext) const {
  assert(pCurr);
  assert(m_entries);
  assert(m_entries_count > 0);

  size_t idx = pCurr->GetIndex();
  assert(idx < size_t(m_entries_count));
  assert(m_entries[idx] == pCurr);

  ++idx;

  if (idx >= size_t(m_entries_count)) {
    long long pos;
    long len;

    const long status = Parse(pos, len);

    if (status < 0) {  // error
      pNext = NULL;
      return status;
    }

    if (status > 0) {
      pNext = NULL;
      return 0;
    }

    assert(m_entries);
    assert(m_entries_count > 0);
    assert(idx < size_t(m_entries_count));
  }

  pNext = m_entries[idx];
  assert(pNext);

  return 0;
}